

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_data_source_read_pcm_frames
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  int iVar1;
  uint uVar2;
  ma_result mVar3;
  ma_result mVar4;
  ma_data_source_base *pDataSourceBase_1;
  long *plVar5;
  ma_uint64 mVar6;
  ma_data_source *pDataSource_00;
  long *pDataSource_01;
  ma_data_source_base *pDataSourceBase;
  ma_format format;
  ma_uint32 channels;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  ma_uint64 *local_50;
  ma_uint64 local_48;
  ulong local_40;
  undefined1 local_34 [4];
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  mVar3 = MA_INVALID_ARGS;
  if (pDataSource != (ma_data_source *)0x0 && frameCount != 0) {
    local_58 = *(int *)((long)pDataSource + 0x40);
    if (*(code **)(*pDataSource + 0x10) != (code *)0x0) {
      iVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,&local_70,&local_54,local_34,0,0);
      if (iVar1 == 0) {
        local_40 = (ulong)local_70;
        local_5c = local_54;
        mVar6 = 0;
        local_68 = 0;
        local_50 = pFramesRead;
        local_48 = frameCount;
        do {
          pDataSource_01 = *(long **)((long)pDataSource + 0x28);
          if ((*(long **)((long)pDataSource + 0x28) == (long *)0x0) &&
             ((mVar3 = MA_SUCCESS, *(long *)((long)pDataSource + 0x30) != 0 ||
              (pDataSource_01 = (long *)pDataSource, *(long *)((long)pDataSource + 0x38) != 0))))
          goto LAB_00165c87;
          mVar3 = ma_data_source_read_pcm_frames_within_range
                            (pDataSource_01,pFramesOut,frameCount - mVar6,(ma_uint64 *)&local_70);
          mVar6 = mVar6 + CONCAT44(uStack_6c,local_70);
          if (mVar3 != MA_SUCCESS) {
            if (mVar3 != MA_AT_END) goto LAB_00165c87;
            if (local_58 == 0) {
              plVar5 = (long *)pDataSource_01[6];
              if (plVar5 == (long *)0x0) {
                mVar3 = MA_SUCCESS;
                if ((code *)pDataSource_01[7] == (code *)0x0) goto LAB_00165c87;
                plVar5 = (long *)(*(code *)pDataSource_01[7])(pDataSource_01);
                *(long **)((long)pDataSource + 0x28) = plVar5;
                if (plVar5 == (long *)0x0) goto LAB_00165c87;
              }
              else {
                *(long **)((long)pDataSource + 0x28) = plVar5;
              }
              if (*(code **)(*plVar5 + 8) == (code *)0x0) goto LAB_00165c77;
              mVar3 = (**(code **)(*plVar5 + 8))(plVar5,plVar5[1]);
            }
            else {
              uVar2 = 0;
              if ((CONCAT44(uStack_6c,local_70) == 0) && (uVar2 = (int)local_68 + 1, 1 < uVar2))
              break;
              if (*(code **)(*pDataSource_01 + 8) == (code *)0x0) {
LAB_00165c77:
                mVar3 = MA_NOT_IMPLEMENTED;
                goto LAB_00165c87;
              }
              if ((ulong)pDataSource_01[2] < (ulong)pDataSource_01[3]) {
                mVar3 = MA_INVALID_OPERATION;
                goto LAB_00165c87;
              }
              mVar3 = (**(code **)(*pDataSource_01 + 8))
                                (pDataSource_01,pDataSource_01[3] + pDataSource_01[1]);
              local_68 = (ulong)uVar2;
              frameCount = local_48;
            }
            if (mVar3 != MA_SUCCESS) goto LAB_00165c87;
          }
          if (pFramesOut == (void *)0x0) {
            pFramesOut = (void *)0x0;
          }
          else {
            pFramesOut = (void *)((long)pFramesOut +
                                 (ulong)(uint)(*(int *)(&DAT_0019a900 + local_40 * 4) * local_5c) *
                                 CONCAT44(uStack_6c,local_70));
          }
        } while (mVar6 < frameCount);
        mVar3 = MA_SUCCESS;
LAB_00165c87:
        if (local_50 != (ma_uint64 *)0x0) {
          *local_50 = mVar6;
        }
        mVar4 = MA_AT_END;
        if (mVar6 != 0) {
          mVar4 = mVar3;
        }
        if (mVar3 == MA_SUCCESS) {
          return mVar4;
        }
        return mVar3;
      }
    }
    pDataSource_00 = *(ma_data_source **)((long)pDataSource + 0x28);
    if (*(ma_data_source **)((long)pDataSource + 0x28) == (ma_data_source *)0x0) {
      if (*(long *)((long)pDataSource + 0x30) == 0) {
        pDataSource_00 = (ma_data_source *)0x0;
        if (*(long *)((long)pDataSource + 0x38) == 0) {
          pDataSource_00 = pDataSource;
        }
      }
      else {
        pDataSource_00 = (ma_data_source *)0x0;
      }
    }
    mVar3 = ma_data_source_read_pcm_frames_within_range
                      (pDataSource_00,pFramesOut,frameCount,pFramesRead);
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_data_source_read_pcm_frames(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;
    ma_data_source_base* pCurrentDataSource;
    void* pRunningFramesOut = pFramesOut;
    ma_uint64 totalFramesProcessed = 0;
    ma_format format;
    ma_uint32 channels;
    ma_uint32 emptyLoopCounter = 0; /* Keeps track of how many times 0 frames have been read. For infinite loop detection of sounds with no audio data. */
    ma_bool32 loop;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    loop = ma_data_source_is_looping(pDataSource);

    /*
    We need to know the data format so we can advance the output buffer as we read frames. If this
    fails, chaining will not work and we'll just read as much as we can from the current source.
    */
    if (ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0) != MA_SUCCESS) {
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            return result;
        }

        return ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pFramesOut, frameCount, pFramesRead);
    }

    /*
    Looping is a bit of a special case. When the `loop` argument is true, chaining will not work and
    only the current data source will be read from.
    */

    /* Keep reading until we've read as many frames as possible. */
    while (totalFramesProcessed < frameCount) {
        ma_uint64 framesProcessed;
        ma_uint64 framesRemaining = frameCount - totalFramesProcessed;

        /* We need to resolve the data source that we'll actually be reading from. */
        result = ma_data_source_resolve_current(pDataSource, (ma_data_source**)&pCurrentDataSource);
        if (result != MA_SUCCESS) {
            break;
        }

        if (pCurrentDataSource == NULL) {
            break;
        }

        result = ma_data_source_read_pcm_frames_within_range(pCurrentDataSource, pRunningFramesOut, framesRemaining, &framesProcessed);
        totalFramesProcessed += framesProcessed;

        /*
        If we encountered an error from the read callback, make sure it's propagated to the caller. The caller may need to know whether or not MA_BUSY is returned which is
        not necessarily considered an error.
        */
        if (result != MA_SUCCESS && result != MA_AT_END) {
            break;
        }

        /*
        We can determine if we've reached the end by checking if ma_data_source_read_pcm_frames_within_range() returned
        MA_AT_END. To loop back to the start, all we need to do is seek back to the first frame.
        */
        if (result == MA_AT_END) {
            /*
            The result needs to be reset back to MA_SUCCESS (from MA_AT_END) so that we don't
            accidentally return MA_AT_END when data has been read in prior loop iterations. at the
            end of this function, the result will be checked for MA_SUCCESS, and if the total
            number of frames processed is 0, will be explicitly set to MA_AT_END.
            */
            result = MA_SUCCESS;

            /*
            We reached the end. If we're looping, we just loop back to the start of the current
            data source. If we're not looping we need to check if we have another in the chain, and
            if so, switch to it.
            */
            if (loop) {
                if (framesProcessed == 0) {
                    emptyLoopCounter += 1;
                    if (emptyLoopCounter > 1) {
                        break;  /* Infinite loop detected. Get out. */
                    }
                } else {
                    emptyLoopCounter = 0;
                }

                result = ma_data_source_seek_to_pcm_frame(pCurrentDataSource, pCurrentDataSource->loopBegInFrames);
                if (result != MA_SUCCESS) {
                    break;  /* Failed to loop. Abort. */
                }

                /* Don't return MA_AT_END for looping sounds. */
                result = MA_SUCCESS;
            } else {
                if (pCurrentDataSource->pNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->pNext;
                } else if (pCurrentDataSource->onGetNext != NULL) {
                    pDataSourceBase->pCurrent = pCurrentDataSource->onGetNext(pCurrentDataSource);
                    if (pDataSourceBase->pCurrent == NULL) {
                        break;  /* Our callback did not return a next data source. We're done. */
                    }
                } else {
                    /* Reached the end of the chain. We're done. */
                    break;
                }

                /* The next data source needs to be rewound to ensure data is read in looping scenarios. */
                result = ma_data_source_seek_to_pcm_frame(pDataSourceBase->pCurrent, 0);
                if (result != MA_SUCCESS) {
                    break;
                }
            }
        }

        if (pRunningFramesOut != NULL) {
            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesProcessed * ma_get_bytes_per_frame(format, channels));
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesProcessed;
    }

    MA_ASSERT(!(result == MA_AT_END && totalFramesProcessed > 0));  /* We should never be returning MA_AT_END if we read some data. */

    if (result == MA_SUCCESS && totalFramesProcessed == 0) {
        result  = MA_AT_END;
    }

    return result;
}